

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O3

bool __thiscall State::isSolvable(State *this)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int *__src;
  size_t __n;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 *puVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined8 uStack_60;
  undefined1 auStack_58 [8];
  int **local_50;
  size_t local_48;
  undefined1 *local_40;
  State *local_38;
  
  uVar2 = this->size;
  uVar10 = (ulong)uVar2;
  lVar1 = -(uVar10 * 4 + 0xf & 0xfffffffffffffff0);
  local_40 = auStack_58 + lVar1;
  iVar3 = this->height;
  local_38 = this;
  if (0 < (long)iVar3) {
    uVar4 = this->width;
    local_50 = this->tiles;
    local_48 = (ulong)uVar4 << 2;
    uVar7 = 0;
    lVar11 = 0;
    do {
      __n = local_48;
      if (0 < (int)uVar4) {
        puVar8 = local_40 + uVar7 * 4;
        __src = local_50[lVar11];
        *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1047d4;
        memcpy(puVar8,__src,__n);
      }
      lVar11 = lVar11 + 1;
      uVar7 = (ulong)(uint)((int)uVar7 + iVar3);
    } while (iVar3 != lVar11);
  }
  if ((int)uVar2 < 1) {
    bVar5 = false;
  }
  else {
    uVar6 = 0;
    bVar5 = false;
    uVar7 = uVar10;
    puVar8 = local_40;
    do {
      lVar1 = uVar6 * 4;
      uVar6 = uVar6 + 1;
      if (uVar6 < uVar10 && *(int *)(local_40 + lVar1) != 0) {
        uVar9 = 1;
        do {
          bVar5 = (bool)(bVar5 ^ (*(int *)(puVar8 + uVar9 * 4) < *(int *)(local_40 + lVar1) &&
                                 *(int *)(puVar8 + uVar9 * 4) != 0));
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      puVar8 = puVar8 + 4;
      uVar7 = uVar7 - 1;
    } while (uVar6 != uVar10);
  }
  if (local_38->width == 0) {
    bVar5 = (bool)(bVar5 ^ (iVar3 - (local_38->blank).height & 0x80000001U) == 1);
  }
  else {
    bVar5 = !bVar5;
  }
  return bVar5;
}

Assistant:

bool State::isSolvable() {
    int swaps = 0;
    int flatTiles[size];

    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            flatTiles[height * i + j] = tiles[i][j];
        }
    }

    for (int i = 0; i < size; i++) {
        int tile = flatTiles[i];
        if (tile == 0) continue;

        for (int j = i + 1; j < size; j++) {
            int nextTile = flatTiles[j];
            if (nextTile == 0) continue;

            if (tile > nextTile) {
                swaps++;
            }
        }
    }

    bool evenSwaps = swaps % 2 == 0;
    bool blankOddRow = (height - blank.height) % 2 == 1;

    // Giving credit where credit is due.
    // http://www.cs.bham.ac.uk/~mdr/teaching/modules04/java2/TilesSolvability.html
    return width == 0 ? blankOddRow == evenSwaps : evenSwaps;
}